

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O1

void run::run_node(Node *n,Program *p,VM *vm)

{
  char cVar1;
  NodeKind NVar2;
  int iVar3;
  pointer pcVar4;
  iterator __position;
  pointer piVar5;
  pointer piVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  pointer pcVar10;
  undefined1 *__args;
  Parser PStack_98;
  
  do {
    NVar2 = (((FunctionNode *)n)->super_Node).kind;
    if (NVar2 != Return) {
      switch(NVar2) {
      case UnaryExpr:
        goto switchD_00110803_caseD_3;
      case BinExpr:
        run_node((Node *)(((FunctionNode *)n)->name)._M_dataplus._M_p,p,vm);
        run_node((Node *)(((FunctionNode *)n)->name)._M_string_length,p,vm);
        piVar5 = (vm->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (vm->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar8 = (long)piVar6 - (long)piVar5;
        if (uVar8 < 5) {
          return;
        }
        iVar7 = *(int *)((long)piVar5 + (uVar8 - 8));
        uVar9 = (uint)(byte)(((FunctionNode *)n)->super_Node).field_0xc;
        if (uVar9 - 0x25 < 0xb) {
          iVar3 = *(int *)((long)piVar5 + (uVar8 - 4));
          switch(uVar9) {
          case 0x25:
            iVar7 = iVar7 % iVar3;
            break;
          case 0x2a:
            iVar7 = iVar7 * iVar3;
            break;
          case 0x2b:
            iVar7 = iVar7 + iVar3;
            break;
          case 0x2d:
            iVar7 = iVar7 - iVar3;
            break;
          case 0x2f:
            iVar7 = iVar7 / iVar3;
          }
        }
        (vm->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar6 + -1;
        piVar6[-2] = iVar7;
        return;
      case Literal:
        __args = &(((FunctionNode *)n)->super_Node).field_0xc;
        __position._M_current =
             (vm->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (vm->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = *(int *)__args;
          (vm->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
          return;
        }
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)vm,__position,(int *)__args);
        return;
      default:
        return;
      case CompoundStmt:
        pcVar4 = (pointer)(((FunctionNode *)n)->name)._M_string_length;
        for (pcVar10 = (((FunctionNode *)n)->name)._M_dataplus._M_p; pcVar10 != pcVar4;
            pcVar10 = pcVar10 + 8) {
          run_node(*(Node **)pcVar10,p,vm);
        }
        return;
      case Function:
        if (((FunctionNode *)n)->body->block == (CompoundStmt *)0x0) {
          PStack_98.data.fn._M_dataplus._M_p = (pointer)&PStack_98.data.fn.field_2;
          PStack_98.data.fn._M_string_length = 0;
          PStack_98.data.fn.field_2._M_local_buf[0] = '\0';
          PStack_98.data.functions.
          super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          PStack_98.data.functions.
          super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          PStack_98.data.functions.
          super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = 0;
          PStack_98.data.functions.
          super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          PStack_98._60_8_ = 0;
          PStack_98.eof.kind = Eof;
          PStack_98.depth = 0;
          PStack_98.eof.pos.line = 0;
          PStack_98.eof.pos.col = 0;
          PStack_98.eof.i = 0;
          PStack_98.eof.j = 0;
          Parser::parse_function_body
                    (&PStack_98,
                     (p->lex_data).super__Vector_base<LexData,_std::allocator<LexData>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     *(int *)&(((FunctionNode *)n)->body->super_Node).field_0xc,(FunctionNode *)n);
          if (((FunctionNode *)n)->body->block == (CompoundStmt *)0x0) {
            printf("error parsing %s() function body",(((FunctionNode *)n)->name)._M_dataplus._M_p);
            exit(1);
          }
          ParserData::~ParserData(&PStack_98.data);
        }
        run_node((Node *)((FunctionNode *)n)->body->block,p,vm);
        return;
      }
    }
    n = (Node *)(((FunctionNode *)n)->name)._M_dataplus._M_p;
  } while ((FunctionNode *)n != (FunctionNode *)0x0);
  return;
switchD_00110803_caseD_3:
  run_node((Node *)(((FunctionNode *)n)->name)._M_dataplus._M_p,p,vm);
  piVar5 = (vm->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if ((vm->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start == piVar5) {
    return;
  }
  cVar1 = (((FunctionNode *)n)->super_Node).field_0xc;
  if (cVar1 == '!') {
    piVar5[-1] = (uint)(piVar5[-1] == 0);
    return;
  }
  if (cVar1 == '~') {
    piVar5[-1] = ~piVar5[-1];
    return;
  }
  if (cVar1 != '-') {
    return;
  }
  piVar5[-1] = -piVar5[-1];
  return;
}

Assistant:

static void run_node(
  Node* n,
  Program& p,
  VM& vm)
{
  switch (n->kind) {

    case NodeKind::UnaryExpr: {
      auto ue = static_cast<UnaryExpr*>(n);
      run_node(ue->operand, p, vm);
      if (!vm.stack.empty()) {
        switch (ue->op) {
          case '*': break; // TODO
          case '&': break; // TODO
          case '+': break;
          case '-': vm.stack.back() = -vm.stack.back(); break;
          case '!': vm.stack.back() = !vm.stack.back(); break;
          case '~': vm.stack.back() = ~vm.stack.back(); break;
        }
      }
      break;
    }

    case NodeKind::BinExpr: {
      auto be = static_cast<BinExpr*>(n);
      run_node(be->lhs, p, vm);
      run_node(be->rhs, p, vm);

      if (vm.stack.size() >= 2) {
        int x = vm.stack[vm.stack.size()-2];
        int y = vm.stack[vm.stack.size()-1];

        switch (be->op) {
          case '+': x += y; break;
          case '-': x -= y; break;
          case '*': x *= y; break;
          case '/': x /= y; break;
          case '%': x %= y; break;
        }

        vm.stack.pop_back();
        vm.stack.back() = x;
      }
      break;
    }

    case NodeKind::Literal: {
      auto l = static_cast<Literal*>(n);
      vm.stack.push_back(l->value);
      break;
    }

    case NodeKind::Return: {
      auto r = static_cast<Return*>(n);
      // Run the return expression (the result should be left in the stack)
      if (r->expr)
        run_node(r->expr, p, vm);
      break;
    }

    case NodeKind::CompoundStmt: {
      auto e = static_cast<CompoundStmt*>(n);
      for (Stmt* stmt : e->stmts) {
        run_node(stmt, p, vm);
      }
      break;
    }

    case NodeKind::Function: {
      auto f = static_cast<FunctionNode*>(n);
      const LexData& lex_data = p.lex_data[f->body->lex_i];

      // Parse function that was just fast-parsed (only tokens)
      if (!f->body->block) {
        Parser parser;
        parser.parse_function_body(lex_data, f);

        if (!f->body->block) {
          std::printf("error parsing %s() function body", f->name.c_str());
          std::exit(1);
        }
      }

      run_node(f->body->block, p, vm);
      break;
    }

  }
}